

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void uv__queue_done(uv__work *w,int err)

{
  uint uVar1;
  undefined4 in_register_00000034;
  
  uVar1 = ((w[-1].loop)->active_reqs).count;
  if (uVar1 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/threadpool.c"
                  ,0x149,"void uv__queue_done(struct uv__work *, int)");
  }
  ((w[-1].loop)->active_reqs).count = uVar1 - 1;
  if ((code *)w[-1].wq[1] != (code *)0x0) {
    (*(code *)w[-1].wq[1])(w[-3].wq + 1,CONCAT44(in_register_00000034,err));
    return;
  }
  return;
}

Assistant:

static void uv__queue_done(struct uv__work* w, int err) {
  uv_work_t* req;

  req = container_of(w, uv_work_t, work_req);
  uv__req_unregister(req->loop, req);

  if (req->after_work_cb == NULL)
    return;

  req->after_work_cb(req, err);
}